

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall cmLocalGenerator::GenerateTestFiles(cmLocalGenerator *this)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  reference pbVar5;
  reference ppcVar6;
  pointer this_00;
  allocator local_629;
  string local_628;
  string local_608;
  allocator local_5e1;
  string local_5e0;
  string local_5c0;
  allocator local_599;
  string local_598;
  char *local_578;
  char *labels;
  string local_568;
  char *local_548;
  char *directoryLabels;
  string local_520;
  allocator local_4f9;
  cmStateDirectory local_4f8;
  undefined1 local_4d0 [8];
  string outP;
  __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
  local_4a8;
  const_iterator i_1;
  undefined1 local_498 [8];
  string parentBinDir;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> local_460;
  vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_> *local_448;
  vec_t *children;
  __normal_iterator<cmTestGenerator_*const_*,_std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>_>
  local_438;
  const_iterator gi;
  vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_> *testers;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_420;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_418;
  const_iterator i;
  string local_408;
  undefined1 local_3e8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includesList;
  string local_3c8;
  char *local_3a8;
  char *testIncludeFiles;
  string local_398;
  char *local_378;
  char *testIncludeFile;
  cmStateDirectory local_348;
  undefined1 local_320 [8];
  cmGeneratedFileStream fout;
  cmStateDirectory local_d0;
  string local_a8 [8];
  string file;
  string *config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configurationTypes;
  allocator local_31;
  string local_30;
  cmLocalGenerator *local_10;
  cmLocalGenerator *this_local;
  
  pcVar1 = this->Makefile;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"CMAKE_TESTING_ENABLED",&local_31);
  bVar2 = cmMakefile::IsOn(pcVar1,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&config);
    cmMakefile::GetConfigurations
              ((string *)((long)&file.field_2 + 8),this->Makefile,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&config,false);
    cmStateSnapshot::GetDirectory(&local_d0,&this->StateSnapshot);
    pcVar3 = cmStateDirectory::GetCurrentBinary(&local_d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,pcVar3,(allocator *)&fout.field_0x247);
    std::allocator<char>::~allocator((allocator<char> *)&fout.field_0x247);
    std::__cxx11::string::operator+=(local_a8,"/");
    std::__cxx11::string::operator+=(local_a8,"CTestTestfile.cmake");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_320,pcVar3,false,None);
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_320,true);
    poVar4 = std::operator<<((ostream *)local_320,"# CMake generated Testfile for ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"# Source directory: ");
    cmStateSnapshot::GetDirectory(&local_348,&this->StateSnapshot);
    pcVar3 = cmStateDirectory::GetCurrentSource(&local_348);
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"# Build directory: ");
    cmStateSnapshot::GetDirectory((cmStateDirectory *)&testIncludeFile,&this->StateSnapshot);
    pcVar3 = cmStateDirectory::GetCurrentBinary((cmStateDirectory *)&testIncludeFile);
    poVar4 = std::operator<<(poVar4,pcVar3);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"# ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"# This file includes the relevant testing commands ");
    poVar4 = std::operator<<(poVar4,"required for ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"# testing this directory and lists subdirectories to ");
    poVar4 = std::operator<<(poVar4,"be tested as well.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_398,"TEST_INCLUDE_FILE",(allocator *)((long)&testIncludeFiles + 7));
    pcVar3 = cmMakefile::GetProperty(pcVar1,&local_398);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator((allocator<char> *)((long)&testIncludeFiles + 7));
    local_378 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      poVar4 = std::operator<<((ostream *)local_320,"include(\"");
      poVar4 = std::operator<<(poVar4,local_378);
      poVar4 = std::operator<<(poVar4,"\")");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_3c8,"TEST_INCLUDE_FILES",
               (allocator *)
               ((long)&includesList.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar3 = cmMakefile::GetProperty(pcVar1,&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&includesList.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_3a8 = pcVar3;
    if (pcVar3 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_3e8);
      pcVar3 = local_3a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_408,pcVar3,(allocator *)((long)&i._M_current + 7));
      cmSystemTools::ExpandListArgument
                (&local_408,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_3e8,false);
      std::__cxx11::string::~string((string *)&local_408);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i._M_current + 7));
      local_420._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_3e8);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_418,&local_420);
      while( true ) {
        testers = (vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_3e8);
        bVar2 = __gnu_cxx::operator!=
                          (&local_418,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&testers);
        if (!bVar2) break;
        poVar4 = std::operator<<((ostream *)local_320,"include(\"");
        pbVar5 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_418);
        poVar4 = std::operator<<(poVar4,(string *)pbVar5);
        poVar4 = std::operator<<(poVar4,"\")");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_418);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_3e8);
    }
    gi._M_current = (cmTestGenerator **)cmMakefile::GetTestGenerators(this->Makefile);
    local_438._M_current =
         (cmTestGenerator **)
         std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>::begin
                   ((vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_> *)gi._M_current);
    while( true ) {
      children = (vec_t *)std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>::end
                                    ((vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>
                                      *)gi._M_current);
      bVar2 = __gnu_cxx::operator!=
                        (&local_438,
                         (__normal_iterator<cmTestGenerator_*const_*,_std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>_>
                          *)&children);
      if (!bVar2) break;
      ppcVar6 = __gnu_cxx::
                __normal_iterator<cmTestGenerator_*const_*,_std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>_>
                ::operator*(&local_438);
      cmTestGenerator::Compute(*ppcVar6,this);
      ppcVar6 = __gnu_cxx::
                __normal_iterator<cmTestGenerator_*const_*,_std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>_>
                ::operator*(&local_438);
      cmScriptGenerator::Generate
                (&(*ppcVar6)->super_cmScriptGenerator,(ostream *)local_320,
                 (string *)((long)&file.field_2 + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&config);
      __gnu_cxx::
      __normal_iterator<cmTestGenerator_*const_*,_std::vector<cmTestGenerator_*,_std::allocator<cmTestGenerator_*>_>_>
      ::operator++(&local_438);
    }
    cmMakefile::GetStateSnapshot
              ((cmStateSnapshot *)((long)&parentBinDir.field_2 + 8),this->Makefile);
    cmStateSnapshot::GetChildren(&local_460,(cmStateSnapshot *)((long)&parentBinDir.field_2 + 8));
    local_448 = &local_460;
    pcVar3 = GetCurrentBinaryDirectory(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_498,pcVar3,(allocator *)((long)&i_1._M_current + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&i_1._M_current + 7));
    local_4a8._M_current =
         (cmStateSnapshot *)
         std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::begin(local_448);
    while( true ) {
      outP.field_2._8_8_ =
           std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::end(local_448);
      bVar2 = __gnu_cxx::operator!=
                        (&local_4a8,
                         (__normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                          *)((long)&outP.field_2 + 8));
      if (!bVar2) break;
      this_00 = __gnu_cxx::
                __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
                ::operator->(&local_4a8);
      cmStateSnapshot::GetDirectory(&local_4f8,this_00);
      pcVar3 = cmStateDirectory::GetCurrentBinary(&local_4f8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_4d0,pcVar3,&local_4f9);
      std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
      cmOutputConverter::ConvertToRelativePath
                (&local_520,&this->super_cmOutputConverter,(string *)local_498,(string *)local_4d0);
      std::__cxx11::string::operator=((string *)local_4d0,(string *)&local_520);
      std::__cxx11::string::~string((string *)&local_520);
      cmOutputConverter::EscapeForCMake((string *)&directoryLabels,(string *)local_4d0);
      std::__cxx11::string::operator=((string *)local_4d0,(string *)&directoryLabels);
      std::__cxx11::string::~string((string *)&directoryLabels);
      poVar4 = std::operator<<((ostream *)local_320,"subdirs(");
      poVar4 = std::operator<<(poVar4,(string *)local_4d0);
      poVar4 = std::operator<<(poVar4,")");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_4d0);
      __gnu_cxx::
      __normal_iterator<const_cmStateSnapshot_*,_std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>_>
      ::operator++(&local_4a8);
    }
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_568,"CMAKE_DIRECTORY_LABELS",(allocator *)((long)&labels + 7));
    pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_568);
    std::__cxx11::string::~string((string *)&local_568);
    std::allocator<char>::~allocator((allocator<char> *)((long)&labels + 7));
    pcVar1 = this->Makefile;
    local_548 = pcVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_598,"LABELS",&local_599);
    pcVar3 = cmMakefile::GetProperty(pcVar1,&local_598);
    std::__cxx11::string::~string((string *)&local_598);
    std::allocator<char>::~allocator((allocator<char> *)&local_599);
    local_578 = pcVar3;
    if ((pcVar3 != (char *)0x0) || (local_548 != (char *)0x0)) {
      std::operator<<((ostream *)local_320,"set_directory_properties(PROPERTIES LABELS ");
      pcVar3 = local_578;
      if (local_578 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_5e0,pcVar3,&local_5e1);
        cmOutputConverter::EscapeForCMake(&local_5c0,&local_5e0);
        std::operator<<((ostream *)local_320,(string *)&local_5c0);
        std::__cxx11::string::~string((string *)&local_5c0);
        std::__cxx11::string::~string((string *)&local_5e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
      }
      if ((local_578 != (char *)0x0) && (local_548 != (char *)0x0)) {
        std::operator<<((ostream *)local_320,";");
      }
      pcVar3 = local_548;
      if (local_548 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_628,pcVar3,&local_629);
        cmOutputConverter::EscapeForCMake(&local_608,&local_628);
        std::operator<<((ostream *)local_320,(string *)&local_608);
        std::__cxx11::string::~string((string *)&local_608);
        std::__cxx11::string::~string((string *)&local_628);
        std::allocator<char>::~allocator((allocator<char> *)&local_629);
      }
      poVar4 = std::operator<<((ostream *)local_320,")");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    std::__cxx11::string::~string((string *)local_498);
    std::vector<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>::~vector(&local_460);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_320);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&config);
  }
  return;
}

Assistant:

void cmLocalGenerator::GenerateTestFiles()
{
  if (!this->Makefile->IsOn("CMAKE_TESTING_ENABLED")) {
    return;
  }

  // Compute the set of configurations.
  std::vector<std::string> configurationTypes;
  const std::string& config =
    this->Makefile->GetConfigurations(configurationTypes, false);

  std::string file = this->StateSnapshot.GetDirectory().GetCurrentBinary();
  file += "/";
  file += "CTestTestfile.cmake";

  cmGeneratedFileStream fout(file.c_str());
  fout.SetCopyIfDifferent(true);

  fout << "# CMake generated Testfile for " << std::endl
       << "# Source directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentSource() << std::endl
       << "# Build directory: "
       << this->StateSnapshot.GetDirectory().GetCurrentBinary() << std::endl
       << "# " << std::endl
       << "# This file includes the relevant testing commands "
       << "required for " << std::endl
       << "# testing this directory and lists subdirectories to "
       << "be tested as well." << std::endl;

  const char* testIncludeFile =
    this->Makefile->GetProperty("TEST_INCLUDE_FILE");
  if (testIncludeFile) {
    fout << "include(\"" << testIncludeFile << "\")" << std::endl;
  }

  const char* testIncludeFiles =
    this->Makefile->GetProperty("TEST_INCLUDE_FILES");
  if (testIncludeFiles) {
    std::vector<std::string> includesList;
    cmSystemTools::ExpandListArgument(testIncludeFiles, includesList);
    for (std::vector<std::string>::const_iterator i = includesList.begin();
         i != includesList.end(); ++i) {
      fout << "include(\"" << *i << "\")" << std::endl;
    }
  }

  // Ask each test generator to write its code.
  std::vector<cmTestGenerator*> const& testers =
    this->Makefile->GetTestGenerators();
  for (std::vector<cmTestGenerator*>::const_iterator gi = testers.begin();
       gi != testers.end(); ++gi) {
    (*gi)->Compute(this);
    (*gi)->Generate(fout, config, configurationTypes);
  }
  typedef std::vector<cmStateSnapshot> vec_t;
  vec_t const& children = this->Makefile->GetStateSnapshot().GetChildren();
  std::string parentBinDir = this->GetCurrentBinaryDirectory();
  for (vec_t::const_iterator i = children.begin(); i != children.end(); ++i) {
    // TODO: Use add_subdirectory instead?
    std::string outP = i->GetDirectory().GetCurrentBinary();
    outP = this->ConvertToRelativePath(parentBinDir, outP);
    outP = cmOutputConverter::EscapeForCMake(outP);
    fout << "subdirs(" << outP << ")" << std::endl;
  }

  // Add directory labels property
  const char* directoryLabels =
    this->Makefile->GetDefinition("CMAKE_DIRECTORY_LABELS");
  const char* labels = this->Makefile->GetProperty("LABELS");

  if (labels || directoryLabels) {
    fout << "set_directory_properties(PROPERTIES LABELS ";
    if (labels) {
      fout << cmOutputConverter::EscapeForCMake(labels);
    }
    if (labels && directoryLabels) {
      fout << ";";
    }
    if (directoryLabels) {
      fout << cmOutputConverter::EscapeForCMake(directoryLabels);
    }
    fout << ")" << std::endl;
  }
}